

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O2

void __thiscall amrex::BARef::BARef(BARef *this,size_t size)

{
  allocator_type local_9;
  
  std::vector<amrex::Box,_std::allocator<amrex::Box>_>::vector
            ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)this,size,&local_9);
  (this->bbox).smallend.vect[0] = 1;
  (this->bbox).smallend.vect[1] = 1;
  (this->bbox).smallend.vect[2] = 1;
  (this->bbox).bigend.vect[0] = 0;
  (this->bbox).bigend.vect[1] = 0;
  *(undefined8 *)((this->bbox).bigend.vect + 2) = 0;
  *(undefined8 *)&(this->bbox).btype = 0;
  (this->crsn).vect[1] = 0;
  (this->crsn).vect[2] = 0;
  (this->hash)._M_h._M_buckets = &(this->hash)._M_h._M_single_bucket;
  (this->hash)._M_h._M_bucket_count = 1;
  (this->hash)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->hash)._M_h._M_element_count = 0;
  (this->hash)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->hash)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->hash)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->has_hashmap = false;
  return;
}

Assistant:

BARef::BARef (size_t size)
    : m_abox(size)
{
#ifdef AMREX_MEM_PROFILING
    updateMemoryUsage_box(1);
#endif
}